

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void logFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  void *pvVar2;
  int in_ESI;
  sqlite3_context *in_RDI;
  double dVar3;
  double dVar4;
  sqlite3_context *pCtx;
  double ans;
  double b;
  double x;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  sqlite3_value *pVal;
  
  pVal = (sqlite3_value *)0xffffffffffffffff;
  iVar1 = sqlite3_value_numeric_type((sqlite3_value *)0xffffffffffffffff);
  if ((iVar1 == 1 || iVar1 == 2) &&
     (dVar3 = sqlite3_value_double((sqlite3_value *)0x226444), 0.0 < dVar3)) {
    if (in_ESI == 2) {
      iVar1 = sqlite3_value_numeric_type(pVal);
      if (iVar1 != 1 && iVar1 != 2) {
        return;
      }
      dVar3 = log(dVar3);
      if (dVar3 <= 0.0) {
        return;
      }
      dVar4 = sqlite3_value_double((sqlite3_value *)0x2264ad);
      if (dVar4 <= 0.0) {
        return;
      }
      dVar4 = log(dVar4);
      pCtx = (sqlite3_context *)(dVar4 / dVar3);
    }
    else {
      pvVar2 = sqlite3_user_data(in_RDI);
      in_stack_ffffffffffffffcc = (int)pvVar2;
      if (in_stack_ffffffffffffffcc == 1) {
        pCtx = (sqlite3_context *)log10(dVar3);
      }
      else if (in_stack_ffffffffffffffcc == 2) {
        pCtx = (sqlite3_context *)log2(dVar3);
      }
      else {
        pCtx = (sqlite3_context *)log(dVar3);
      }
    }
    sqlite3_result_double
              (pCtx,(double)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  return;
}

Assistant:

static void logFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  double x, b, ans;
  assert( argc==1 || argc==2 );
  switch( sqlite3_value_numeric_type(argv[0]) ){
    case SQLITE_INTEGER:
    case SQLITE_FLOAT:
      x = sqlite3_value_double(argv[0]);
      if( x<=0.0 ) return;
      break;
    default:
      return;
  }
  if( argc==2 ){
    switch( sqlite3_value_numeric_type(argv[0]) ){
      case SQLITE_INTEGER:
      case SQLITE_FLOAT:
        b = log(x);
        if( b<=0.0 ) return;
        x = sqlite3_value_double(argv[1]);
        if( x<=0.0 ) return;
        break;
     default:
        return;
    }
    ans = log(x)/b;
  }else{
    switch( SQLITE_PTR_TO_INT(sqlite3_user_data(context)) ){
      case 1:
        ans = log10(x);
        break;
      case 2:
        ans = log2(x);
        break;
      default:
        ans = log(x);
        break;
    }
  }
  sqlite3_result_double(context, ans);
}